

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::
visit_null(basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_> *this,
          semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  bool bVar1;
  reference pvVar2;
  basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_> *pbVar3;
  size_type sVar4;
  wchar_t *in_RDI;
  basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>
  *in_stack_ffffffffffffff90;
  basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>
  *in_stack_ffffffffffffffa0;
  stream_sink<wchar_t> *in_stack_ffffffffffffffb0;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_40;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_30 [3];
  
  bVar1 = std::
          vector<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
          ::empty((vector<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
                   *)in_stack_ffffffffffffffa0);
  if (!bVar1) {
    pvVar2 = std::
             vector<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
             ::back((vector<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
                     *)in_stack_ffffffffffffff90);
    bVar1 = encoding_context::is_array(pvVar2);
    if (bVar1) {
      begin_scalar_value(in_stack_ffffffffffffffa0);
    }
    pvVar2 = std::
             vector<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
             ::back((vector<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
                     *)in_stack_ffffffffffffff90);
    bVar1 = encoding_context::is_multi_line(pvVar2);
    if (!bVar1) {
      in_stack_ffffffffffffffa0 =
           *(basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_> **)
            (in_RDI + 0x6a);
      pbVar3 = (basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_> *
               )basic_json_encode_options<wchar_t>::line_length_limit
                          ((basic_json_encode_options<wchar_t> *)(in_RDI + 0x10));
      if (pbVar3 <= in_stack_ffffffffffffffa0) {
        break_line(in_stack_ffffffffffffff90);
      }
    }
  }
  pbVar3 = (basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_> *)
           (in_RDI + 2);
  local_30[0] = null_constant();
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::data(local_30);
  local_40 = null_constant();
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size(&local_40);
  stream_sink<wchar_t>::append(in_stack_ffffffffffffffb0,in_RDI,(size_t)in_stack_ffffffffffffffa0);
  null_constant();
  sVar4 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                     &stack0xffffffffffffffb0);
  *(size_type *)(in_RDI + 0x6a) = sVar4 + *(long *)(in_RDI + 0x6a);
  end_value(pbVar3);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_null(semantic_tag, const ser_context&, std::error_code&) final
        {
            if (!stack_.empty()) 
            {
                if (stack_.back().is_array())
                {
                    begin_scalar_value();
                }
                if (!stack_.back().is_multi_line() && column_ >= options_.line_length_limit())
                {
                    break_line();
                }
            }

            sink_.append(null_constant().data(), null_constant().size());
            column_ += null_constant().size();

            end_value();
            JSONCONS_VISITOR_RETURN;
        }